

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::createAccessMemberNode(Parser *this,Token *t,Node *container,Node *key)

{
  Node *this_00;
  Node *key_local;
  Node *container_local;
  
  if (key == (Node *)0x0 || container == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    key_local = key;
    container_local = container;
    this_00 = (Node *)operator_new(0x30);
    Node::Node(this_00,this->ctx,t);
    this_00->nodeType = PNT_ACCESS_MEMBER;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&container_local);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&key_local);
  }
  return this_00;
}

Assistant:

Node * createAccessMemberNode(Token & t, Node * container, Node * key)
  {
    if (!container || !key)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_ACCESS_MEMBER;
    n->children.push_back(container);
    n->children.push_back(key);
    return n;
  }